

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O1

FormulaUnit * __thiscall FOOLElimination::apply(FOOLElimination *this,FormulaUnit *unit)

{
  Formula *f;
  UnitList *pUVar1;
  bool bVar2;
  FormulaUnit *this_00;
  Formula *pFVar3;
  UnitList *pUVar4;
  ostream *poVar5;
  undefined1 local_98 [32];
  void *local_78;
  float fStack_70;
  float fStack_6c;
  char *local_68;
  size_type sStack_60;
  SplitSet *local_58;
  void *pvStack_50;
  void *local_48;
  float fStack_40;
  float fStack_3c;
  NonspecificInferenceMany local_38;
  
  bVar2 = needsElimination(unit);
  this_00 = unit;
  if (bVar2) {
    this_00 = Shell::Rectify::rectify(unit,true);
    f = this_00->_formula;
    this->_unit = &this_00->super_Unit;
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (&this->_varSorts);
    Kernel::SortHelper::collectVariableSorts(f,&this->_varSorts,false);
    pFVar3 = process(this,f);
    if (f != pFVar3) {
      pUVar1 = this->_currentDefs;
      pUVar4 = (UnitList *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
      pUVar4->_head = &this_00->super_Unit;
      pUVar4->_tail = pUVar1;
      this->_currentDefs = pUVar4;
      this_00 = (FormulaUnit *)::operator_new(0x48,8);
      local_38.premises = this->_currentDefs;
      local_38.rule = FOOL_ELIMINATION;
      Kernel::Inference::Inference((Inference *)&local_68,&local_38);
      local_78 = local_48;
      fStack_70 = fStack_40;
      fStack_6c = fStack_3c;
      local_98._16_8_ = local_58;
      local_98._24_8_ = pvStack_50;
      local_98._0_8_ = local_68;
      local_98._8_8_ = sStack_60;
      Kernel::Unit::Unit((Unit *)this_00,FORMULA,(Inference *)local_98);
      this_00->_formula = pFVar3;
      this_00->_cachedColor = COLOR_INVALID;
      this_00->_cachedWeight = 0;
      Kernel::Unit::doUnitTracing((Unit *)this_00);
      this->_currentDefs = (UnitList *)0x0;
      if ((*(char *)(::Lib::env + 0x913a) != '\0') || ((*(byte *)(::Lib::env + 0xa1d2) & 1) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[PP] ",5);
        Kernel::FormulaUnit::toString_abi_cxx11_((string *)local_98,unit);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[PP] ",5);
        Kernel::FormulaUnit::toString_abi_cxx11_((string *)local_98,this_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
      }
    }
  }
  return this_00;
}

Assistant:

FormulaUnit* FOOLElimination::apply(FormulaUnit* unit) {
  if (!needsElimination(unit)) {
    return unit;
  }

  FormulaUnit* rectifiedUnit = Rectify::rectify(unit);

  Formula* formula = rectifiedUnit->formula();

  _unit = rectifiedUnit;
  _varSorts.reset();

  SortHelper::collectVariableSorts(formula, _varSorts);

  Formula* processedFormula = process(formula);
  if (formula == processedFormula) {
    return rectifiedUnit;
  }

  // add the master premise to the definitions and pass them to the inference object
  UnitList::push(rectifiedUnit,_currentDefs);
  FormulaUnit* processedUnit = new FormulaUnit(processedFormula,
      NonspecificInferenceMany(InferenceRule::FOOL_ELIMINATION, _currentDefs));
  _currentDefs = UnitList::empty();

  if (env.options->showPreprocessing()) {
    std::cout << "[PP] " << unit->toString() << endl;
    std::cout << "[PP] " << processedUnit->toString()  << endl;
  }

  return processedUnit;
}